

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

Abc_Cex_t * Gia_ManAreDeriveCex(Gia_ManAre_t *p,Gia_StaAre_t *pLast)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  uint *__ptr;
  void *pvVar5;
  uint **ppuVar6;
  Abc_Cex_t *pAVar7;
  int iVar8;
  long lVar9;
  Gia_StaAre_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  Gia_StaAre_t *pGVar14;
  uint nFrames;
  
  if (p->iOutFail < 0) {
    __assert_fail("p->iOutFail >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x785,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  Gia_ManAreDeriveCexSatStart(p);
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar5 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar5;
  ppuVar6 = p->ppStas;
  pGVar10 = (Gia_StaAre_t *)*ppuVar6;
  if (pGVar10 != pLast) {
    nFrames = 0;
    uVar12 = 1000;
    pGVar14 = pLast;
    do {
      if (pGVar14 != pLast) {
        uVar11 = (uint)uVar12;
        if (nFrames == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(0x80);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = 0x10;
            uVar12 = 0x10;
          }
          else {
            uVar12 = (ulong)(uVar11 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(uVar12 * 8);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),uVar12 * 8);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar11 * 2;
          }
        }
        else {
          pvVar5 = *(void **)(__ptr + 2);
        }
        lVar9 = (long)(int)nFrames;
        nFrames = nFrames + 1;
        *(Gia_StaAre_t **)((long)pvVar5 + lVar9 * 8) = pGVar14;
        ppuVar6 = p->ppStas;
        pGVar10 = (Gia_StaAre_t *)*ppuVar6;
      }
      pGVar14 = (Gia_StaAre_t *)
                ((ulong)((uint)pGVar14->iPrev & 0xfffff) * (long)p->nSize * 4 +
                *(long *)((long)ppuVar6 + (ulong)((uint)pGVar14->iPrev >> 0x11 & 0x3ff8)));
    } while (pGVar10 != pGVar14);
    if (0 < (int)nFrames) {
      iVar8 = p->pAig->nRegs;
      pAVar7 = Abc_CexAlloc(iVar8,p->pAig->vCis->nSize - iVar8,nFrames);
      pAVar7->iFrame = nFrames - 1;
      pAVar7->iPo = p->iOutFail;
      pvVar5 = *(void **)(__ptr + 2);
      uVar12 = 0;
      pGVar10 = (Gia_StaAre_t *)0x0;
      do {
        iVar8 = -1;
        if (uVar12 == 0) {
          iVar8 = p->iOutFail;
        }
        pGVar14 = *(Gia_StaAre_t **)((long)pvVar5 + uVar12 * 8);
        Gia_ManAreDeriveCexSat(p,pGVar14,pGVar10,iVar8);
        pVVar1 = p->vCofVars;
        if (0 < pVVar1->nSize) {
          piVar2 = pVVar1->pArray;
          pGVar3 = p->pAig;
          pVVar4 = pGVar3->vCis;
          lVar9 = 0;
          do {
            iVar8 = pGVar3->nRegs;
            iVar13 = pVVar4->nSize - iVar8;
            if (iVar13 <= piVar2[lVar9]) {
              __assert_fail("Var < Gia_ManPiNum(p->pAig)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x79a,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)")
              ;
            }
            iVar8 = iVar8 + piVar2[lVar9] + iVar13 * (~(uint)uVar12 + nFrames);
            (&pAVar7[1].iPo)[iVar8 >> 5] = (&pAVar7[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            lVar9 = lVar9 + 1;
          } while (lVar9 < pVVar1->nSize);
        }
        uVar12 = uVar12 + 1;
        pGVar10 = pGVar14;
      } while (uVar12 != nFrames);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
      }
      free(__ptr);
      Gia_ManAreDeriveCexSatStop(p);
      return pAVar7;
    }
  }
  __assert_fail("Vec_PtrSize(vStates) >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                ,0x78c,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
}

Assistant:

Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast )
{
    Abc_Cex_t * pCex;
    Vec_Ptr_t * vStates;
    Gia_StaAre_t * pSta, * pPrev;
    int Var, i, v;
    assert( p->iOutFail >= 0 );
    Gia_ManAreDeriveCexSatStart( p );
    // compute the trace
    vStates = Vec_PtrAlloc( 1000 );
    for ( pSta = pLast; Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        if ( pSta != pLast )
            Vec_PtrPush( vStates, pSta );
    assert( Vec_PtrSize(vStates) >= 1 );
    // start the counter-example
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pAig), Gia_ManPiNum(p->pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = p->iOutFail;
    // compute states
    pPrev = NULL;
    Vec_PtrForEachEntry( Gia_StaAre_t *, vStates, pSta, i )
    {
        Gia_ManAreDeriveCexSat( p, pSta, pPrev, (i == 0) ? p->iOutFail : -1 ); 
        pPrev = pSta;
        // create the counter-example
        Vec_IntForEachEntry( p->vCofVars, Var, v )
        {
            assert( Var < Gia_ManPiNum(p->pAig) );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pAig) + (Vec_PtrSize(vStates)-1-i) * Gia_ManPiNum(p->pAig) + Var );
        }
    }
    // free temporary things
    Vec_PtrFree( vStates );
    Gia_ManAreDeriveCexSatStop( p );
    return pCex;
}